

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall helics::CoreBroker::checkDependencies(CoreBroker *this)

{
  int iVar1;
  byte *pbVar2;
  size_t size;
  BaseTimeCoordinator *pBVar3;
  iterator iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  GlobalFederateId *dep;
  pointer pGVar7;
  GlobalFederateId GVar8;
  pointer pBVar9;
  uint uVar10;
  pointer __rhs;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  string_view str;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> dependencies;
  ActionMessage addDep;
  ActionMessage rmdep_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_1b0;
  pointer local_1a8;
  undefined1 local_1a0 [16];
  pointer local_190;
  SmallBuffer local_160;
  byte *local_e8;
  size_t local_e0;
  size_type local_d8;
  ulong uStack_d0;
  
  if ((this->super_BrokerBase).field_0x294 == '\x01') {
    __rhs = (this->delayedDependencies).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    local_1a8 = (this->delayedDependencies).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (__rhs != local_1a8) {
      local_1b0 = (_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&(this->mFederates).lookup1;
      do {
        local_1a0._8_8_ = (__rhs->first)._M_dataplus._M_p;
        local_1a0._0_8_ = (__rhs->first)._M_string_length;
        iVar4 = std::
                _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(local_1b0,(key_type *)local_1a0);
        if (iVar4.
            super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
            ._M_cur == (__node_type *)0x0) {
          pBVar9 = (this->mFederates).dataStorage.
                   super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          pBVar9 = (this->mFederates).dataStorage.
                   super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start +
                   *(long *)((long)iVar4.
                                   super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                                   ._M_cur + 0x18);
        }
        if (pBVar9 == (this->mFederates).dataStorage.
                      super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          ActionMessage::ActionMessage
                    ((ActionMessage *)local_1a0,cmd_log,(GlobalFederateId)0x0,
                     (GlobalFederateId)(__rhs->second).gid);
          local_1a0._4_4_ = 3;
          std::operator+(&local_1d0,"unable to locate ",&__rhs->first);
          pbVar5 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                             (&local_1d0," to establish dependency");
          local_e8 = (byte *)&local_d8;
          pbVar2 = (byte *)(pbVar5->_M_dataplus)._M_p;
          paVar6 = &pbVar5->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pbVar2 == paVar6) {
            local_d8 = paVar6->_M_allocated_capacity;
            uStack_d0 = *(ulong *)((long)&pbVar5->field_2 + 8);
          }
          else {
            local_d8 = paVar6->_M_allocated_capacity;
            local_e8 = pbVar2;
          }
          pbVar2 = local_e8;
          size = pbVar5->_M_string_length;
          (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
          pbVar5->_M_string_length = 0;
          (pbVar5->field_2)._M_local_buf[0] = '\0';
          local_e0 = size;
          if ((local_e8 != local_160.heap) && (SmallBuffer::reserve(&local_160,size), size != 0)) {
            local_160.bufferSize = size;
            memcpy(local_160.heap,pbVar2,size);
            size = local_160.bufferSize;
          }
          local_160.bufferSize = size;
          if (local_e8 != (byte *)&local_d8) {
            operator_delete(local_e8,local_d8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          str._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
          str._M_len = (this->super_BrokerBase).identifier._M_string_length;
          ActionMessage::setString((ActionMessage *)local_1a0,0,str);
          routeMessage(this,(ActionMessage *)local_1a0);
          ActionMessage::~ActionMessage((ActionMessage *)local_1a0);
        }
        else {
          ActionMessage::ActionMessage
                    ((ActionMessage *)local_1a0,cmd_add_dependency,
                     (GlobalFederateId)(__rhs->second).gid,(GlobalFederateId)(pBVar9->global_id).gid
                    );
          routeMessage(this,(ActionMessage *)local_1a0);
          ActionMessage::ActionMessage
                    ((ActionMessage *)&local_e8,cmd_add_dependent,
                     (GlobalFederateId)(pBVar9->global_id).gid,(GlobalFederateId)(__rhs->second).gid
                    );
          ActionMessage::operator=((ActionMessage *)local_1a0,(ActionMessage *)&local_e8);
          ActionMessage::~ActionMessage((ActionMessage *)&local_e8);
          routeMessage(this,(ActionMessage *)local_1a0);
          ActionMessage::~ActionMessage((ActionMessage *)local_1a0);
        }
        __rhs = __rhs + 1;
      } while (__rhs != local_1a8);
    }
    BaseTimeCoordinator::getDependents
              ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
               local_1a0,
               (this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
    lVar11 = local_1a0._8_8_ - local_1a0._0_8_;
    if ((pointer)local_1a0._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1a0._0_8_,(long)local_190 - local_1a0._0_8_);
    }
    if (lVar11 == 4) {
      BaseTimeCoordinator::getDependents
                ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                 local_1a0,
                 (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
      GVar8.gid = *(BaseType *)local_1a0._0_8_;
      operator_delete((void *)local_1a0._0_8_,(long)local_190 - local_1a0._0_8_);
      BaseTimeCoordinator::getDependencies
                ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                 &local_1d0,
                 (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
      if (local_1d0._M_string_length - (long)local_1d0._M_dataplus._M_p == 4) {
        if (*(uint *)local_1d0._M_dataplus._M_p == GVar8.gid) {
          ActionMessage::ActionMessage((ActionMessage *)local_1a0,cmd_remove_interdependency);
          local_1a0._8_4_ = (this->super_BrokerBase).global_broker_id_local.gid;
          routeMessage(this,(ActionMessage *)local_1a0,GVar8);
          pBVar3 = (this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
          (*pBVar3->_vptr_BaseTimeCoordinator[6])(pBVar3,(ulong)(uint)GVar8.gid);
          pBVar3 = (this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
          (*pBVar3->_vptr_BaseTimeCoordinator[7])(pBVar3,(ulong)(uint)GVar8.gid);
        }
        else {
          ActionMessage::ActionMessage((ActionMessage *)local_1a0,cmd_add_dependent);
          local_1a0._8_4_ = GVar8.gid;
          ActionMessage::ActionMessage((ActionMessage *)&local_e8,cmd_remove_dependent);
          local_e0 = CONCAT44(local_e0._4_4_,(this->super_BrokerBase).global_broker_id_local.gid);
          routeMessage(this,(ActionMessage *)local_1a0,
                       (GlobalFederateId)*(BaseType *)local_1d0._M_dataplus._M_p);
          routeMessage(this,(ActionMessage *)&local_e8,
                       (GlobalFederateId)*(BaseType *)local_1d0._M_dataplus._M_p);
          ActionMessage::setAction((ActionMessage *)local_1a0,cmd_add_dependency);
          local_1a0._8_4_ = *(uint *)local_1d0._M_dataplus._M_p;
          ActionMessage::setAction((ActionMessage *)&local_e8,cmd_remove_dependency);
          routeMessage(this,(ActionMessage *)local_1a0,GVar8);
          routeMessage(this,(ActionMessage *)&local_e8,GVar8);
          pBVar3 = (this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
          (*pBVar3->_vptr_BaseTimeCoordinator[6])(pBVar3,(ulong)*(uint *)local_1d0._M_dataplus._M_p)
          ;
          pBVar3 = (this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
          (*pBVar3->_vptr_BaseTimeCoordinator[7])(pBVar3,(ulong)(uint)GVar8.gid);
          ActionMessage::~ActionMessage((ActionMessage *)&local_e8);
        }
        ActionMessage::~ActionMessage((ActionMessage *)local_1a0);
      }
      if ((uint *)local_1d0._M_dataplus._M_p != (uint *)0x0) {
        operator_delete(local_1d0._M_dataplus._M_p,
                        local_1d0.field_2._M_allocated_capacity - (long)local_1d0._M_dataplus._M_p);
      }
    }
  }
  else {
    BaseTimeCoordinator::getDependents
              ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
               local_1a0,
               (this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
    uVar12 = local_1a0._8_8_ - local_1a0._0_8_;
    if ((pointer)local_1a0._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1a0._0_8_,(long)local_190 - local_1a0._0_8_);
    }
    if (uVar12 < 9) {
      BaseTimeCoordinator::getDependents
                ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                 local_1a0,
                 (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
      uVar10 = 0;
      if (local_1a0._0_8_ == local_1a0._8_8_) {
        GVar8.gid = -2010000000;
      }
      else {
        GVar8.gid = -2010000000;
        pGVar7 = (pointer)local_1a0._0_8_;
        do {
          iVar1 = pGVar7->gid;
          bVar13 = iVar1 != (this->super_BrokerBase).higher_broker_id.gid;
          if (bVar13) {
            GVar8.gid = iVar1;
          }
          uVar10 = uVar10 + bVar13;
          pGVar7 = pGVar7 + 1;
        } while (pGVar7 != (pointer)local_1a0._8_8_);
        uVar10 = (uint)(uVar10 == 1);
      }
      if ((pointer)local_1a0._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1a0._0_8_,(long)local_190 - local_1a0._0_8_);
      }
      if ((char)uVar10 != '\0') {
        pBVar3 = (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
        (*pBVar3->_vptr_BaseTimeCoordinator[6])
                  (pBVar3,(ulong)(uint)(this->super_BrokerBase).higher_broker_id.gid);
        pBVar3 = (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
        (*pBVar3->_vptr_BaseTimeCoordinator[6])(pBVar3,(ulong)(uint)GVar8.gid);
        pBVar3 = (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
        (*pBVar3->_vptr_BaseTimeCoordinator[7])
                  (pBVar3,(ulong)(uint)(this->super_BrokerBase).higher_broker_id.gid);
        pBVar3 = (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
        (*pBVar3->_vptr_BaseTimeCoordinator[7])(pBVar3,(ulong)(uint)GVar8.gid);
        ActionMessage::ActionMessage((ActionMessage *)local_1a0,cmd_remove_interdependency);
        local_1a0._8_4_ = (this->super_BrokerBase).global_broker_id_local.gid;
        routeMessage(this,(ActionMessage *)local_1a0,
                     (GlobalFederateId)(this->super_BrokerBase).higher_broker_id.gid);
        routeMessage(this,(ActionMessage *)local_1a0,GVar8);
        ActionMessage::ActionMessage((ActionMessage *)&local_e8,cmd_add_interdependency);
        uStack_d0 = uStack_d0 | 0x40000000;
        local_e0._0_4_ = GVar8.gid;
        routeMessage(this,(ActionMessage *)&local_e8,
                     (GlobalFederateId)(this->super_BrokerBase).higher_broker_id.gid);
        local_e0 = CONCAT44(local_e0._4_4_,(this->super_BrokerBase).higher_broker_id.gid);
        uStack_d0 = uStack_d0 & 0xffffffff9fffffff | 0x20000000;
        routeMessage(this,(ActionMessage *)&local_e8,GVar8);
        ActionMessage::~ActionMessage((ActionMessage *)&local_e8);
        ActionMessage::~ActionMessage((ActionMessage *)local_1a0);
      }
    }
  }
  return;
}

Assistant:

void CoreBroker::checkDependencies()
{
    if (isRootc) {
        for (const auto& newdep : delayedDependencies) {
            auto depfed = mFederates.find(newdep.first);
            if (depfed != mFederates.end()) {
                ActionMessage addDep(CMD_ADD_DEPENDENCY, newdep.second, depfed->global_id);
                routeMessage(addDep);
                addDep = ActionMessage(CMD_ADD_DEPENDENT, depfed->global_id, newdep.second);
                routeMessage(addDep);
            } else {
                ActionMessage logWarning(CMD_LOG, parent_broker_id, newdep.second);
                logWarning.messageID = WARNING;
                logWarning.payload =
                    "unable to locate " + newdep.first + " to establish dependency";
                logWarning.setString(0, getIdentifier());
                routeMessage(logWarning);
            }
        }

        if (timeCoord->getDependents().size() == 1) {  // if there is just one dependency remove it
            auto depid{timeCoord->getDependents()[0]};
            auto dependencies = timeCoord->getDependencies();
            if (dependencies.size() == 1) {
                if (dependencies.front() != depid) {
                    ActionMessage adddep(CMD_ADD_DEPENDENT);
                    adddep.source_id = depid;
                    ActionMessage rmdep(CMD_REMOVE_DEPENDENT);
                    rmdep.source_id = global_broker_id_local;
                    routeMessage(adddep, dependencies.front());
                    routeMessage(rmdep, dependencies.front());

                    adddep.setAction(CMD_ADD_DEPENDENCY);
                    adddep.source_id = dependencies.front();
                    rmdep.setAction(CMD_REMOVE_DEPENDENCY);
                    routeMessage(adddep, depid);
                    routeMessage(rmdep, depid);

                    timeCoord->removeDependency(dependencies.front());
                    timeCoord->removeDependent(depid);
                } else {
                    ActionMessage rmdep(CMD_REMOVE_INTERDEPENDENCY);
                    rmdep.source_id = global_broker_id_local;

                    routeMessage(rmdep, depid);
                    timeCoord->removeDependency(depid);
                    timeCoord->removeDependent(depid);
                }
            }
        }
    } else {
        // if there is more than 2 dependents(higher broker + 2 or more other objects then we
        // need to be a timeCoordinator
        if (timeCoord->getDependents().size() > 2) {
            return;
        }

        GlobalFederateId fedid;
        int localcnt = 0;
        for (const auto& dep : timeCoord->getDependents()) {
            if (dep != higher_broker_id) {
                ++localcnt;
                fedid = dep;
            }
        }
        if (localcnt != 1) {
            return;
        }
        // remove the core from the time dependency chain
        timeCoord->removeDependency(higher_broker_id);
        timeCoord->removeDependency(fedid);
        timeCoord->removeDependent(higher_broker_id);
        timeCoord->removeDependent(fedid);

        ActionMessage rmdep(CMD_REMOVE_INTERDEPENDENCY);

        rmdep.source_id = global_broker_id_local;
        routeMessage(rmdep, higher_broker_id);
        routeMessage(rmdep, fedid);

        ActionMessage adddep(CMD_ADD_INTERDEPENDENCY);
        adddep.source_id = fedid;
        setActionFlag(adddep, child_flag);
        routeMessage(adddep, higher_broker_id);
        adddep.source_id = higher_broker_id;
        clearActionFlag(adddep, child_flag);
        setActionFlag(adddep, parent_flag);
        routeMessage(adddep, fedid);
    }
}